

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_12d0e3::brotli_context::_emit(brotli_context *this,bool is_last,bool force_flush)

{
  pointer *ppsVar1;
  iterator __position;
  bool bVar2;
  size_t out_size;
  uint8_t *output;
  h2o_iovec_t local_28;
  size_t local_18;
  uint8_t *local_10;
  
  bVar2 = brotli::BrotliCompressor::WriteBrotliData
                    (this->brotli_,is_last,force_flush,&local_18,&local_10);
  if (bVar2) {
    if (local_18 != 0) {
      local_28 = h2o_strdup((h2o_mem_pool_t *)0x0,(char *)local_10,local_18);
      __position._M_current =
           (this->bufs_).super__Vector_base<st_h2o_iovec_t,_std::allocator<st_h2o_iovec_t>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->bufs_).super__Vector_base<st_h2o_iovec_t,_std::allocator<st_h2o_iovec_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<st_h2o_iovec_t,_std::allocator<st_h2o_iovec_t>_>::
        _M_realloc_insert<st_h2o_iovec_t>(&this->bufs_,__position,&local_28);
      }
      else {
        (__position._M_current)->base = local_28.base;
        (__position._M_current)->len = local_28.len;
        ppsVar1 = &(this->bufs_).super__Vector_base<st_h2o_iovec_t,_std::allocator<st_h2o_iovec_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppsVar1 = *ppsVar1 + 1;
      }
    }
    return;
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/handler/compress/brotli.cc"
                ,0x4b,"void (anonymous namespace)::brotli_context::_emit(bool, bool)");
}

Assistant:

void brotli_context::_emit(bool is_last, bool force_flush)
{
    uint8_t *output;
    size_t out_size;
    bool ret = brotli_->WriteBrotliData(is_last, force_flush, &out_size, &output);
    assert(ret);
    (void)ret;
    if (out_size != 0)
        bufs_.push_back(h2o_strdup(NULL, reinterpret_cast<const char *>(output), out_size));
}